

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusBGPOMDPPlanner.cpp
# Opt level: O0

QFunctionsDiscrete * __thiscall
PerseusBGPOMDPPlanner::BackupStageSamplingAlt
          (PerseusBGPOMDPPlanner *this,BeliefSet *S,QFunctionsDiscrete *Q)

{
  bool bVar1;
  size_type sVar2;
  size_t sVar3;
  ulong uVar4;
  const_reference ppJVar5;
  long *plVar6;
  vector<double,_std::allocator<double>_> *pvVar7;
  reference pvVar8;
  ostream *poVar9;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  *in_RCX;
  Perseus *in_RDX;
  Perseus *in_RSI;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  *in_RDI;
  double dVar10;
  reference rVar11;
  reference rVar12;
  int b;
  int nrImprovedByAlpha;
  double x;
  uint a;
  ValueFunctionPOMDPDiscrete Qalphas;
  GaoVectorSet Gao;
  ValueFunctionPOMDPDiscrete V;
  AlphaVector alpha;
  vector<bool,_std::allocator<bool>_> stillNeedToBeImproved;
  int k;
  int nrS;
  int nrNotImproved;
  int nrB;
  vector<double,_std::allocator<double>_> VBalpha;
  vector<double,_std::allocator<double>_> VB;
  QFunctionsDiscrete *Q1;
  AlphaVectorPlanning *in_stack_fffffffffffffbd8;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffbe0;
  AlphaVector *in_stack_fffffffffffffbe8;
  ostream *in_stack_fffffffffffffbf0;
  ostream *in_stack_fffffffffffffbf8;
  AlphaVector *in_stack_fffffffffffffc00;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  *in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc10;
  int in_stack_fffffffffffffc14;
  QFunctionsDiscrete *in_stack_fffffffffffffc18;
  _Bit_type *in_stack_fffffffffffffc20;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffc28;
  undefined7 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc37;
  _Bit_type in_stack_fffffffffffffc38;
  _Bit_type *in_stack_fffffffffffffc40;
  undefined7 in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4f;
  ValueFunctionPOMDPDiscrete *in_stack_fffffffffffffc50;
  Perseus *in_stack_fffffffffffffc58;
  ostream *in_stack_fffffffffffffc60;
  ostream *in_stack_fffffffffffffc68;
  QFunctionsDiscrete *in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffc9c;
  Perseus *in_stack_fffffffffffffca0;
  reference local_240;
  reference local_230;
  int local_220;
  int local_21c;
  double local_1d8;
  undefined1 local_1d0 [84];
  uint local_17c;
  undefined1 local_160 [152];
  AlphaVector local_c8;
  byte local_9b;
  undefined1 local_99;
  int local_70;
  undefined4 local_5c;
  int local_58;
  int local_54;
  vector<double,_std::allocator<double>_> local_50;
  vector<double,_std::allocator<double>_> local_38;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  *local_20;
  Perseus *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  BeliefValue::GetValues
            ((BeliefSet *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
             in_stack_fffffffffffffc90);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x955bac);
  sVar2 = std::vector<double,_std::allocator<double>_>::size(&local_38);
  local_58 = (int)sVar2;
  local_54 = local_58;
  AlphaVectorPlanning::GetPU(in_stack_fffffffffffffbd8);
  sVar3 = PlanningUnitMADPDiscrete::GetNrStates(in_stack_fffffffffffffbe0);
  local_5c = (undefined4)sVar3;
  local_99 = 1;
  std::allocator<bool>::allocator((allocator<bool> *)0x955c42);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffc00,
             (size_type)in_stack_fffffffffffffbf8,(bool *)in_stack_fffffffffffffbf0,
             (allocator_type *)in_stack_fffffffffffffbe8);
  std::allocator<bool>::~allocator((allocator<bool> *)0x955c76);
  local_9b = 0;
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::size(local_20);
  std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>::allocator
            ((allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_> *)0x955ca8);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
            *)in_stack_fffffffffffffc00,(size_type)in_stack_fffffffffffffbf8,
           (allocator_type *)in_stack_fffffffffffffbf0);
  std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>::~allocator
            ((allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_> *)0x955cd4);
  AlphaVector::AlphaVector(in_stack_fffffffffffffc00,(size_t)in_stack_fffffffffffffbf8);
  AlphaVectorPlanning::QFunctionsToValueFunction(in_stack_fffffffffffffc18);
  Perseus::BackupStageLeadIn(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::vector
            ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)0x955d2e);
  rVar11._M_mask = in_stack_fffffffffffffc38;
  rVar11._M_p = in_stack_fffffffffffffc40;
  rVar12._M_mask = (_Bit_type)in_stack_fffffffffffffc18;
  rVar12._M_p = in_stack_fffffffffffffc20;
  local_70 = -1;
  while (local_58 != 0) {
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::clear
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)0x955d54);
    local_17c = 0;
    while( true ) {
      uVar4 = (ulong)local_17c;
      AlphaVectorPlanning::GetPU(in_stack_fffffffffffffbd8);
      sVar3 = PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x955d9c);
      if (uVar4 == sVar3) break;
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffca0,
                 (vector<bool,_std::allocator<bool>_> *)
                 CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      local_70 = Perseus::SampleNotImprovedBeliefIndex
                           ((Perseus *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30)
                            ,in_stack_fffffffffffffc28,rVar12._M_p._4_4_);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x955e16);
      ppJVar5 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::
                operator[]((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                            *)local_18,(long)local_70);
      (*in_RSI->_vptr_Perseus[0xf])(local_1d0,in_RSI,*ppJVar5,(ulong)local_17c,local_160,local_20);
      AlphaVector::operator=(in_stack_fffffffffffffbe8,(AlphaVector *)in_stack_fffffffffffffbe0);
      AlphaVector::~AlphaVector((AlphaVector *)0x955e84);
      ppJVar5 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::
                operator[]((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                            *)local_18,(long)local_70);
      plVar6 = (long *)((long)&(*ppJVar5)->field_0x0 + *(long *)((long)**ppJVar5 + -0xb8));
      pvVar7 = AlphaVector::GetValues(&local_c8);
      dVar10 = (double)(**(code **)(*plVar6 + 0x80))(plVar6,pvVar7);
      local_1d8 = dVar10;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_38,(long)local_70);
      if (*pvVar8 <= dVar10) {
        in_stack_fffffffffffffc9c = Perseus::GetVerbose(in_RSI);
        if (in_stack_fffffffffffffc9c != 0) {
          poVar9 = std::operator<<((ostream *)&std::cout,"Added vector for action ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_17c);
          poVar9 = std::operator<<(poVar9,", belief ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_70);
          poVar9 = std::operator<<(poVar9," (Q ");
          in_stack_fffffffffffffc68 = (ostream *)std::ostream::operator<<(poVar9,local_1d8);
          in_stack_fffffffffffffc60 = std::operator<<(in_stack_fffffffffffffc68," >= ");
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_38,(long)local_70);
          poVar9 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffc60,*pvVar8);
          poVar9 = std::operator<<(poVar9,")");
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        }
      }
      else {
        in_stack_fffffffffffffca0 = local_18;
        std::
        vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ::operator[](local_20,(ulong)local_17c);
        BeliefValue::GetMaximizingVector
                  ((BeliefSet *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                   rVar11._M_p._4_4_,(ValueFunctionPOMDPDiscrete *)rVar11._M_mask);
        AlphaVector::operator=(in_stack_fffffffffffffbe8,(AlphaVector *)in_stack_fffffffffffffbe0);
        AlphaVector::~AlphaVector((AlphaVector *)0x955fb8);
      }
      std::
      vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
      ::operator[](in_RDI,(ulong)local_17c);
      in_stack_fffffffffffffc4f =
           AlphaVectorPlanning::VectorIsInValueFunction
                     ((AlphaVector *)in_stack_fffffffffffffc08,
                      (ValueFunctionPOMDPDiscrete *)in_stack_fffffffffffffc00);
      if (!(bool)in_stack_fffffffffffffc4f) {
        std::
        vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ::operator[](in_RDI,(ulong)local_17c);
        std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back
                  ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffffbf0,
                   in_stack_fffffffffffffbe8);
      }
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back
                ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffffbf0,
                 in_stack_fffffffffffffbe8);
      local_17c = local_17c + 1;
    }
    BeliefValue::GetValues
              ((BeliefSet *)in_stack_fffffffffffffc68,
               (ValueFunctionPOMDPDiscrete *)in_stack_fffffffffffffc60);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbe8);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0);
    local_21c = 0;
    for (local_220 = 0; local_220 != local_54; local_220 = local_220 + 1) {
      rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffc00,
                          (size_type)in_stack_fffffffffffffbf8);
      local_230 = rVar11;
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_230);
      in_stack_fffffffffffffc37 = false;
      if (bVar1) {
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_50,(long)local_220)
        ;
        in_stack_fffffffffffffc28 = (vector<bool,_std::allocator<bool>_> *)*pvVar8;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_38,(long)local_220)
        ;
        in_stack_fffffffffffffc37 = *pvVar8 <= (double)in_stack_fffffffffffffc28;
      }
      if ((bool)in_stack_fffffffffffffc37 != false) {
        rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffc00,
                            (size_type)in_stack_fffffffffffffbf8);
        local_240 = rVar12;
        std::_Bit_reference::operator=(&local_240,false);
        local_58 = local_58 + -1;
        local_21c = local_21c + 1;
      }
    }
    in_stack_fffffffffffffc14 = Perseus::GetVerbose(in_RSI);
    if (in_stack_fffffffffffffc14 != 0) {
      in_stack_fffffffffffffc08 =
           (multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
            *)std::operator<<((ostream *)&std::cout,"Added vectors for ");
      in_stack_fffffffffffffc00 =
           (AlphaVector *)std::ostream::operator<<(in_stack_fffffffffffffc08,local_70);
      in_stack_fffffffffffffbf8 = std::operator<<((ostream *)in_stack_fffffffffffffc00," (V ");
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_50,(long)local_70);
      in_stack_fffffffffffffbf0 =
           (ostream *)std::ostream::operator<<(in_stack_fffffffffffffbf8,*pvVar8);
      in_stack_fffffffffffffbe8 =
           (AlphaVector *)std::operator<<(in_stack_fffffffffffffbf0," improved ");
      in_stack_fffffffffffffbe0 =
           (PlanningUnitMADPDiscrete *)std::ostream::operator<<(in_stack_fffffffffffffbe8,local_21c)
      ;
      in_stack_fffffffffffffbd8 =
           (AlphaVectorPlanning *)std::operator<<((ostream *)in_stack_fffffffffffffbe0,")");
      std::ostream::operator<<(in_stack_fffffffffffffbd8,std::endl<char,std::char_traits<char>>);
    }
  }
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::multi_array((multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                 *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                in_stack_fffffffffffffc08);
  Perseus::BackupStageLeadOut
            (in_stack_fffffffffffffca0,
             (GaoVectorSet *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::~multi_array((multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                  *)in_stack_fffffffffffffbe0);
  local_9b = 1;
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
            ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffffbf0);
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::~multi_array((multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                  *)in_stack_fffffffffffffbe0);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
            ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffffbf0);
  AlphaVector::~AlphaVector((AlphaVector *)0x9565e2);
  if ((local_9b & 1) == 0) {
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               *)in_stack_fffffffffffffbf0);
  }
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x95665f)
  ;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0);
  return in_RDI;
}

Assistant:

QFunctionsDiscrete
PerseusBGPOMDPPlanner::BackupStageSamplingAlt(const BeliefSet &S,
                                              const QFunctionsDiscrete &Q) const
{
    vector<double> VB=BeliefValue::GetValues(S,Q),
        VBalpha;

    int nrB=VB.size(),
        nrNotImproved=nrB,
        nrS=GetPU()->GetNrStates(),
        k;
    vector<bool> stillNeedToBeImproved(nrB,true);
    QFunctionsDiscrete Q1(Q.size());
    AlphaVector alpha(nrS);

    ValueFunctionPOMDPDiscrete V=QFunctionsToValueFunction(Q);
    GaoVectorSet Gao=BackupStageLeadIn(V);

    ValueFunctionPOMDPDiscrete Qalphas;

    k=-1;

    while(nrNotImproved!=0)
    {
        Qalphas.clear();
        for(unsigned int a=0;a!=GetPU()->GetNrJointActions();++a)
        {
            // sample a belief index from the number of not improved beliefs
            k=SampleNotImprovedBeliefIndex(stillNeedToBeImproved,
                                           nrNotImproved);

            // backup the belief
            alpha=BeliefBackup(*S[k],a,Gao,Q);

            // check whether alpha improves the value of S[k]
            double x=S[k]->InnerProduct(alpha.GetValues());
            // if not, get copy from old value function
            if(x<VB[k]) //QB[a][k])//VB[k])
            {
#if DEBUG_PerseusBGPOMDPPlanner
                cout << "Getting n-1 vector for action " << a << ", belief "
                     << k << " (" << x << " < " << VB[k] << ")" << endl;
#endif
                alpha=BeliefValue::GetMaximizingVector(S,k,Q[a]);
            }
            else
            {
                if(GetVerbose())
                    cout << "Added vector for action " << a << ", belief " 
                         << k << " (Q " << x << " >= " << VB[k] << ")"
                         << endl;
            }
            
            // add alpha to Q1
            if(!VectorIsInValueFunction(alpha,Q1[a]))
                Q1[a].push_back(alpha);
            Qalphas.push_back(alpha);
        }

        // update which beliefs have been improved
        VBalpha=BeliefValue::GetValues(S,Qalphas);
        int nrImprovedByAlpha=0;
        for(int b=0;b!=nrB;b++)
            if(stillNeedToBeImproved[b] && VBalpha[b]>=VB[b])
            {
                stillNeedToBeImproved[b]=false;
                nrNotImproved--;
                nrImprovedByAlpha++;
            }
        
        if(GetVerbose())
            cout << "Added vectors for " << k << " (V " << VBalpha[k] 
                 << " improved " << nrImprovedByAlpha << ")" << endl;
    }

    BackupStageLeadOut(Gao);

    return(Q1);
}